

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int lws_http_get_uri_and_method(lws *wsi,char **puri_ptr,int *puri_len)

{
  int iVar1;
  char *pcVar2;
  int local_30;
  int local_2c;
  int count;
  int n;
  int *puri_len_local;
  char **puri_ptr_local;
  lws *wsi_local;
  
  local_30 = 0;
  for (local_2c = 0; local_2c < 9; local_2c = local_2c + 1) {
    iVar1 = lws_hdr_total_length(wsi,(uint)""[local_2c]);
    if (iVar1 != 0) {
      local_30 = local_30 + 1;
    }
  }
  if (local_30 == 0) {
    _lws_log(2,"Missing URI in HTTP request\n");
    return -1;
  }
  if ((local_30 == 1) ||
     ((((*(ulong *)&wsi->field_0x2dc >> 1 & 1) != 0 || ((*(ulong *)&wsi->field_0x2dc >> 4 & 1) != 0)
       ) && (iVar1 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_COLON_PATH), iVar1 != 0)))) {
    for (local_2c = 0; local_2c < 9; local_2c = local_2c + 1) {
      iVar1 = lws_hdr_total_length(wsi,(uint)""[local_2c]);
      if (iVar1 != 0) {
        pcVar2 = lws_hdr_simple_ptr(wsi,(uint)""[local_2c]);
        *puri_ptr = pcVar2;
        iVar1 = lws_hdr_total_length(wsi,(uint)""[local_2c]);
        *puri_len = iVar1;
        return local_2c;
      }
    }
  }
  else {
    _lws_log(2,"multiple methods?\n");
  }
  return -1;
}

Assistant:

int
lws_http_get_uri_and_method(struct lws *wsi, char **puri_ptr, int *puri_len)
{
	int n, count = 0;

	for (n = 0; n < (int)LWS_ARRAY_SIZE(methods); n++)
		if (lws_hdr_total_length(wsi, methods[n]))
			count++;
	if (!count) {
		lwsl_warn("Missing URI in HTTP request\n");
		return -1;
	}

	if (count != 1 &&
	    !((wsi->mux_substream || wsi->h2_stream_carries_ws) &&
	      lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COLON_PATH))) {
		lwsl_warn("multiple methods?\n");
		return -1;
	}

	for (n = 0; n < (int)LWS_ARRAY_SIZE(methods); n++)
		if (lws_hdr_total_length(wsi, methods[n])) {
			*puri_ptr = lws_hdr_simple_ptr(wsi, methods[n]);
			*puri_len = lws_hdr_total_length(wsi, methods[n]);
			return n;
		}

	return -1;
}